

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall
FIX::IncorrectDataFormat::IncorrectDataFormat(IncorrectDataFormat *this,int f,string *what)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Incorrect data format for value",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,what);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__Exception_0017e9c0;
  this->field = f;
  return;
}

Assistant:

IncorrectDataFormat( int f = 0, const std::string& what = "" )
    : Exception( "Incorrect data format for value", what ),
                 field( f ) {}